

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.h
# Opt level: O2

void __thiscall
UnifiedRegex::SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::
SyncToLiteralAndBackupInstT
          (SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *this,InstTag tag,
          CharCount offset,CharCount length,CountDomain *backup)

{
  (this->super_Inst).tag = tag;
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.super_LiteralMixin.offset = offset;
  (this->super_EquivScannerMixinT<1U>).super_ScannerMixin.super_LiteralMixin.length = length;
  TextbookBoyerMoore<char16_t>::TextbookBoyerMoore
            (&(this->super_EquivScannerMixinT<1U>).super_ScannerMixin.scanner);
  (this->super_BackupMixin).backup = *backup;
  return;
}

Assistant:

SyncToLiteralAndBackupInstT(InstTag tag, CharCount offset, CharCount length, const CountDomain& backup) : Inst(tag), ScannerT(offset, length), BackupMixin(backup) {}